

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O1

void __thiscall CEExecOptions::~CEExecOptions(CEExecOptions *this)

{
  pointer pcVar1;
  
  (this->super_CLOptions)._vptr_CLOptions = (_func_int **)&PTR__CEExecOptions_00114c10;
  pcVar1 = (this->prog_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->prog_name_).field_2) {
    operator_delete(pcVar1);
  }
  CLOptions::~CLOptions(&this->super_CLOptions);
  return;
}

Assistant:

virtual ~CEExecOptions() {}